

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.c
# Opt level: O0

void ResizeIfNeeded(MemoryStream *memory_stream,size_t minimum_needed_size)

{
  uchar *puVar1;
  size_t local_20;
  size_t new_size;
  size_t minimum_needed_size_local;
  MemoryStream *memory_stream_local;
  
  if (memory_stream->size < minimum_needed_size) {
    for (local_20 = memory_stream->size; local_20 < minimum_needed_size; local_20 = local_20 << 1) {
    }
    puVar1 = (uchar *)realloc(memory_stream->buffer,local_20);
    memory_stream->buffer = puVar1;
    memset(memory_stream->buffer + memory_stream->size,0,local_20 - memory_stream->size);
    memory_stream->size = local_20;
  }
  if (memory_stream->end < minimum_needed_size) {
    memory_stream->end = minimum_needed_size;
  }
  return;
}

Assistant:

static void ResizeIfNeeded(MemoryStream *memory_stream, size_t minimum_needed_size)
{
	if (minimum_needed_size > memory_stream->size)
	{
		size_t new_size = memory_stream->size;
		while (new_size < minimum_needed_size)
			new_size <<= 1;

		memory_stream->buffer = (unsigned char*)realloc(memory_stream->buffer, new_size);
		memset(memory_stream->buffer + memory_stream->size, 0, new_size - memory_stream->size);
		memory_stream->size = new_size;
	}

	if (minimum_needed_size > memory_stream->end)
		memory_stream->end = minimum_needed_size;
}